

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_barrier.cpp
# Opt level: O3

int __thiscall SharedBarrier::init(SharedBarrier *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  ContextManager *pCVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  pthread_barrierattr_t barrierattr;
  pthread_barrierattr_t local_44;
  string local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  iVar1 = pthread_barrierattr_init(&local_44);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_40,"Failed to initialize barrierattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = pthread_barrierattr_setpshared(&local_44,1);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_40,"Failed to set PTHREAD_PROCESS_SHARED to barrierattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = pthread_barrier_init
                    ((pthread_barrier_t *)
                     ((this->barrier_)._M_t.
                      super___uniq_ptr_impl<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
                      .super__Head_base<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_false>.
                     _M_head_impl)->ptr_,&local_44,(uint)ctx);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_40,"Failed to initialize barrier: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = pthread_barrierattr_destroy(&local_44);
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(ulong)uVar2;
  if (uVar2 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_40,"Failed to destroy barrierattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_40);
    paVar4 = &local_40.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar4) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      paVar4 = extraout_RAX;
    }
  }
  return (int)paVar4;
}

Assistant:

void SharedBarrier::init(uint32_t count) {
    pthread_barrierattr_t barrierattr;
    if (pthread_barrierattr_init(&barrierattr) != 0) {
        die(format("Failed to initialize barrierattr: %m"));
    }
    if (pthread_barrierattr_setpshared(&barrierattr, PTHREAD_PROCESS_SHARED) != 0) {
        die(format("Failed to set PTHREAD_PROCESS_SHARED to barrierattr: %m"));
    }
    if (pthread_barrier_init(barrier_->get(), &barrierattr, count)) {
        die(format("Failed to initialize barrier: %m"));
    }
    if (pthread_barrierattr_destroy(&barrierattr) != 0) {
        die(format("Failed to destroy barrierattr: %m"));
    }
}